

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::shutdownWrite(BlockedPumpTo *this)

{
  AsyncPipe *this_00;
  StringPtr cancelReason;
  
  cancelReason.content.size_ = 0x1b;
  cancelReason.content.ptr = "shutdownWrite() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  (*(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector[2])();
  this_00 = this->pipe;
  if ((BlockedPumpTo *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncCapabilityStream *)0x0;
  }
  AsyncPipe::shutdownWrite(this_00);
  return;
}

Assistant:

void shutdownWrite() override {
      canceler.cancel("shutdownWrite() was called");
      fulfiller.fulfill(kj::cp(pumpedSoFar));
      pipe.endState(*this);
      pipe.shutdownWrite();
    }